

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_xor.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  initializer_list<unsigned_long> __l;
  initializer_list<float> __l_00;
  initializer_list<float> __l_01;
  initializer_list<float> __l_02;
  initializer_list<float> __l_03;
  initializer_list<float> __l_04;
  initializer_list<float> __l_05;
  initializer_list<float> __l_06;
  initializer_list<float> __l_07;
  initializer_list<notch::core::LabeledData> samples;
  MakeNet *pMVar1;
  LabeledDataset local_438;
  allocator local_3e9;
  string local_3e8 [32];
  anon_class_16_2_8e9ebec1 local_3c8;
  undefined1 local_3b8 [40];
  FixedRate local_390;
  LabeledDataset local_358;
  allocator local_309;
  string local_308 [32];
  CSVWriter local_2e8;
  function<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
  local_2e0;
  allocator<unsigned_long> local_2b9;
  unsigned_long local_2b8 [3];
  iterator local_2a0;
  size_type local_298;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_290;
  MakeNet local_278;
  undefined1 local_230 [8];
  Net xorNet;
  valarray<float> local_1e8;
  float local_1d8 [2];
  iterator local_1d0;
  undefined8 local_1c8;
  valarray<float> local_1c0;
  float local_1ac;
  iterator local_1a8;
  undefined8 local_1a0;
  valarray<float> local_198;
  float local_188 [2];
  iterator local_180;
  undefined8 local_178;
  valarray<float> local_170;
  float local_15c;
  iterator local_158;
  undefined8 local_150;
  valarray<float> local_148;
  float local_138 [2];
  iterator local_130;
  undefined8 local_128;
  valarray<float> local_120 [2];
  float local_fc;
  iterator local_f8;
  undefined8 local_f0;
  valarray<float> local_e8;
  float local_d8 [2];
  iterator local_d0;
  undefined8 local_c8;
  valarray<float> local_c0;
  LabeledData local_b0;
  valarray<float> *local_a0;
  valarray<float> *local_98;
  valarray<float> *local_90;
  valarray<float> *local_88;
  valarray<float> *local_80;
  valarray<float> *local_78;
  iterator local_70;
  undefined8 local_68;
  undefined1 local_60 [8];
  LabeledDataset dataset;
  char **param_2_local;
  int param_1_local;
  
  local_d8[0] = 0.0;
  local_d8[1] = 0.0;
  local_d0 = local_d8;
  local_c8 = 2;
  __l_07._M_len = 2;
  __l_07._M_array = local_d0;
  dataset.outputs.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)param_2;
  notch::core::std::valarray<float>::valarray(&local_c0,__l_07);
  local_fc = 0.0;
  local_f8 = &local_fc;
  local_f0 = 1;
  __l_06._M_len = 1;
  __l_06._M_array = local_f8;
  local_b0.data = &local_c0;
  notch::core::std::valarray<float>::valarray(&local_e8,__l_06);
  local_b0.label = &local_e8;
  local_138[0] = 0.0;
  local_138[1] = 1.0;
  local_130 = local_138;
  local_128 = 2;
  __l_05._M_len = 2;
  __l_05._M_array = local_130;
  notch::core::std::valarray<float>::valarray(local_120,__l_05);
  local_a0 = local_120;
  local_15c = 1.0;
  local_158 = &local_15c;
  local_150 = 1;
  __l_04._M_len = 1;
  __l_04._M_array = local_158;
  notch::core::std::valarray<float>::valarray(&local_148,__l_04);
  local_98 = &local_148;
  local_188[0] = 1.0;
  local_188[1] = 0.0;
  local_180 = local_188;
  local_178 = 2;
  __l_03._M_len = 2;
  __l_03._M_array = local_180;
  notch::core::std::valarray<float>::valarray(&local_170,__l_03);
  local_90 = &local_170;
  local_1ac = 1.0;
  local_1a8 = &local_1ac;
  local_1a0 = 1;
  __l_02._M_len = 1;
  __l_02._M_array = local_1a8;
  notch::core::std::valarray<float>::valarray(&local_198,__l_02);
  local_88 = &local_198;
  local_1d8[0] = 1.0;
  local_1d8[1] = 1.0;
  local_1d0 = local_1d8;
  local_1c8 = 2;
  __l_01._M_len = 2;
  __l_01._M_array = local_1d0;
  notch::core::std::valarray<float>::valarray(&local_1c0,__l_01);
  local_80 = &local_1c0;
  xorNet.lossLayer.super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = 0;
  __l_00._M_len = 1;
  __l_00._M_array =
       (iterator)
       ((long)&xorNet.lossLayer.
               super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi + 4);
  notch::core::std::valarray<float>::valarray(&local_1e8,__l_00);
  local_78 = &local_1e8;
  local_70 = &local_b0;
  local_68 = 4;
  samples._M_len = 4;
  samples._M_array = local_70;
  notch::core::LabeledDataset::LabeledDataset((LabeledDataset *)local_60,samples);
  notch::core::std::valarray<float>::~valarray(&local_1e8);
  notch::core::std::valarray<float>::~valarray(&local_1c0);
  notch::core::std::valarray<float>::~valarray(&local_198);
  notch::core::std::valarray<float>::~valarray(&local_170);
  notch::core::std::valarray<float>::~valarray(&local_148);
  notch::core::std::valarray<float>::~valarray(local_120);
  notch::core::std::valarray<float>::~valarray(&local_e8);
  notch::core::std::valarray<float>::~valarray(&local_c0);
  notch::core::MakeNet::MakeNet(&local_278,0);
  local_2b8[0] = 2;
  local_2b8[1] = 2;
  local_2b8[2] = 1;
  local_2a0 = local_2b8;
  local_298 = 3;
  notch::core::std::allocator<unsigned_long>::allocator(&local_2b9);
  __l._M_len = local_298;
  __l._M_array = local_2a0;
  notch::core::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_290,__l,&local_2b9);
  pMVar1 = notch::core::MakeNet::MultilayerPerceptron
                     (&local_278,&local_290,(Activation *)notch::core::scaledTanh);
  pMVar1 = notch::core::MakeNet::addL2Loss(pMVar1);
  std::
  function<void(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,std::default_delete<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>>&,std::valarray<float>&,int,int)>
  ::
  function<void(&)(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,std::default_delete<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>>&,std::valarray<float>&,int,int),void>
            ((function<void(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,std::default_delete<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>>&,std::valarray<float>&,int,int)>
              *)&local_2e0,notch::core::Init::normalXavier);
  notch::core::MakeNet::init((MakeNet *)local_230,(EVP_PKEY_CTX *)pMVar1);
  notch::core::std::
  function<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
  ::~function(&local_2e0);
  notch::core::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_290);
  notch::core::std::allocator<unsigned_long>::~allocator(&local_2b9);
  notch::core::MakeNet::~MakeNet(&local_278);
  std::operator<<((ostream *)&std::cout,"training set:\n");
  notch::io::CSVWriter::CSVWriter(&local_2e8,(ostream *)&std::cout);
  notch::io::CSVWriter::operator<<(&local_2e8,(LabeledDataset *)local_60);
  std::operator<<((ostream *)&std::cout,"\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_308,"initial",&local_309);
  notch::core::LabeledDataset::LabeledDataset(&local_358,(LabeledDataset *)local_60);
  print_net((string *)local_308,(Net *)local_230,&local_358);
  notch::core::LabeledDataset::~LabeledDataset(&local_358);
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  notch::core::FixedRate::FixedRate(&local_390,0.01,0.9,0.0);
  notch::core::Net::setLearningPolicy((Net *)local_230,&local_390.super_ALearningPolicy);
  notch::core::FixedRate::~FixedRate(&local_390);
  local_3b8._0_4_ = 100;
  local_3c8.xorNet = (Net *)local_230;
  local_3c8.dataset = (LabeledDataset *)local_60;
  std::function<bool(int)>::function<main::__0,void>
            ((function<bool(int)> *)(local_3b8 + 8),&local_3c8);
  notch::core::SGD::train
            ((Net *)local_230,(LabeledDataset *)local_60,500,(EpochCallback *)local_3b8,
             (IterationCallback *)notch::core::noIterationCallback);
  notch::core::EpochCallback::~EpochCallback((EpochCallback *)local_3b8);
  std::operator<<((ostream *)&std::cout,"\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e8,"final",&local_3e9);
  notch::core::LabeledDataset::LabeledDataset(&local_438,(LabeledDataset *)local_60);
  print_net((string *)local_3e8,(Net *)local_230,&local_438);
  notch::core::LabeledDataset::~LabeledDataset(&local_438);
  std::__cxx11::string::~string(local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  notch::core::Net::~Net((Net *)local_230);
  notch::core::LabeledDataset::~LabeledDataset((LabeledDataset *)local_60);
  return 0;
}

Assistant:

int main(int, char *[]) {
    LabeledDataset dataset {{{0,0},{0}},
                            {{0,1},{1}},
                            {{1,0},{1}},
                            {{1,1},{0}}};

    Net xorNet = MakeNet()
        .MultilayerPerceptron({2, 2, 1}, scaledTanh)
        .addL2Loss().init();

    cout << "training set:\n";
    CSVWriter(cout) << dataset;
    cout << "\n";
    print_net("initial", xorNet, dataset);

    xorNet.setLearningPolicy(FixedRate(0.01f /* rate */, 0.9f /* momentum */));
    SGD::train(xorNet, dataset,
               500 /* epochs */,
               EpochCallback { /* every */ 100 /* epochs */,
                /* callback */ [&](int i) {
                   float loss = meanLoss(xorNet, dataset);
                   cout << "epoch " << setw(3) << right << i
                        << " loss = " << setw(10) << left << loss
                        << endl;
                   return false; // don't terminate;
               }});
    cout << "\n";

    print_net("final", xorNet, dataset);
    return 0;
}